

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readArray(OurReader *this,Token *token)

{
  int index_00;
  Value *pVVar1;
  bool local_106;
  bool local_104;
  allocator<char> local_d1;
  String local_d0;
  bool local_a9;
  undefined1 local_a8 [7];
  bool badTokenType;
  Token currentToken;
  Value *pVStack_88;
  bool ok;
  Value *local_80;
  Value *value;
  undefined1 local_70 [8];
  Token endArray;
  int index;
  undefined1 local_48 [8];
  Value init;
  Token *token_local;
  OurReader *this_local;
  
  init.limit_ = (ptrdiff_t)token;
  Value::Value((Value *)local_48,arrayValue);
  pVVar1 = currentValue(this);
  Value::swapPayload(pVVar1,(Value *)local_48);
  pVVar1 = currentValue(this);
  Value::setOffsetStart(pVVar1,*(long *)(init.limit_ + 8) - (long)this->begin_);
  endArray.end_._0_4_ = 0;
  do {
    skipSpaces(this);
    if (((this->current_ != this->end_) && (*this->current_ == ']')) &&
       (((int)endArray.end_ == 0 ||
        ((((this->features_).allowTrailingCommas_ & 1U) != 0 &&
         (((this->features_).allowDroppedNullPlaceholders_ & 1U) == 0)))))) {
      readToken(this,(Token *)local_70);
      this_local._7_1_ = true;
      goto LAB_009c8f8d;
    }
    pVVar1 = currentValue(this);
    index_00 = (int)endArray.end_;
    endArray.end_._0_4_ = (int)endArray.end_ + 1;
    pVStack_88 = Value::operator[](pVVar1,index_00);
    local_80 = pVStack_88;
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
              (&this->nodes_,&stack0xffffffffffffff78);
    currentToken.end_._7_1_ = readValue(this);
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
              (&this->nodes_);
    if ((currentToken.end_._7_1_ & 1) == 0) {
      this_local._7_1_ = recoverFromError(this,tokenArrayEnd);
      goto LAB_009c8f8d;
    }
    currentToken.end_._7_1_ = readToken(this,(Token *)local_a8);
    while( true ) {
      local_104 = false;
      if (local_a8._0_4_ == tokenComment) {
        local_104 = (bool)currentToken.end_._7_1_;
      }
      if (local_104 == false) break;
      currentToken.end_._7_1_ = readToken(this,(Token *)local_a8);
    }
    local_106 = local_a8._0_4_ != tokenArraySeparator && local_a8._0_4_ != tokenArrayEnd;
    local_a9 = local_106;
    if (((bool)currentToken.end_._7_1_ == false) ||
       (local_a8._0_4_ != tokenArraySeparator && local_a8._0_4_ != tokenArrayEnd)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"Missing \',\' or \']\' in array declaration",&local_d1);
      this_local._7_1_ = addErrorAndRecover(this,&local_d0,(Token *)local_a8,tokenArrayEnd);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
      goto LAB_009c8f8d;
    }
  } while (local_a8._0_4_ != tokenArrayEnd);
  this_local._7_1_ = true;
LAB_009c8f8d:
  value._4_4_ = 1;
  Value::~Value((Value *)local_48);
  return this_local._7_1_;
}

Assistant:

bool OurReader::readArray(Token& token) {
  Value init(arrayValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(token.start_ - begin_);
  int index = 0;
  for (;;) {
    skipSpaces();
    if (current_ != end_ && *current_ == ']' &&
        (index == 0 ||
         (features_.allowTrailingCommas_ &&
          !features_.allowDroppedNullPlaceholders_))) // empty array or trailing
                                                      // comma
    {
      Token endArray;
      readToken(endArray);
      return true;
    }
    Value& value = currentValue()[index++];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenArrayEnd);

    Token currentToken;
    // Accept Comment after last item in the array.
    ok = readToken(currentToken);
    while (currentToken.type_ == tokenComment && ok) {
      ok = readToken(currentToken);
    }
    bool badTokenType = (currentToken.type_ != tokenArraySeparator &&
                         currentToken.type_ != tokenArrayEnd);
    if (!ok || badTokenType) {
      return addErrorAndRecover("Missing ',' or ']' in array declaration",
                                currentToken, tokenArrayEnd);
    }
    if (currentToken.type_ == tokenArrayEnd)
      break;
  }
  return true;
}